

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Sintatico::expressao_simples(Sintatico *this)

{
  bool bVar1;
  bool local_19;
  Sintatico *this_local;
  
  bVar1 = Tokens::isEqual((Tokens *)this,this->tok,7);
  if (bVar1) {
    eat(this,7);
  }
  else {
    bVar1 = Tokens::isEqual((Tokens *)this,this->tok,8);
    if (bVar1) {
      eat(this,8);
    }
  }
  termo(this);
  while( true ) {
    bVar1 = Tokens::isEqual((Tokens *)this,this->tok,7);
    local_19 = true;
    if (!bVar1) {
      local_19 = Tokens::isEqual((Tokens *)this,this->tok,8);
    }
    if (local_19 == false) break;
    operador_aditivo(this);
    termo(this);
  }
  return;
}

Assistant:

void Sintatico::expressao_simples() {
  if (isEqual(tok, MAIS)) eat(MAIS);
  else if (isEqual(tok, MENOS)) eat(MENOS);
  termo();
  while (isEqual(tok,MAIS) ||
         isEqual(tok,MENOS)) {
    operador_aditivo();
    // cout << "vai dar merda...\n";
    termo();
    // cout << "..deu merda\n";
  }
  // cout << "cabou expressao\n";
}